

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

string * __thiscall
LexData::comment_text_abi_cxx11_(string *__return_storage_ptr__,LexData *this,Token *tok)

{
  allocator<char> local_41;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  Token *local_20;
  Token *tok_local;
  LexData *this_local;
  
  local_20 = tok;
  tok_local = (Token *)this;
  this_local = (LexData *)__return_storage_ptr__;
  local_30._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->comments);
  local_28 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_30,(long)local_20->i);
  local_40._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->comments);
  local_38 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_40,(long)local_20->j);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((string *)__return_storage_ptr__,local_28,local_38,&local_41);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string comment_text(const Token& tok) const {
    return std::string(comments.begin()+tok.i,
                       comments.begin()+tok.j);
  }